

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O0

uint32_t Hacl_Bignum4096_32_lt_mask(uint32_t *a,uint32_t *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t blt;
  uint32_t beq;
  uint32_t i;
  uint32_t acc;
  uint32_t *b_local;
  uint32_t *a_local;
  
  beq = 0;
  for (blt = 0; blt < 0x80; blt = blt + 1) {
    uVar1 = FStar_UInt32_eq_mask(a[blt],b[blt]);
    uVar2 = FStar_UInt32_gte_mask(a[blt],b[blt]);
    beq = uVar1 & beq | (uVar1 ^ 0xffffffff) & (uVar2 ^ 0xffffffff);
  }
  return beq;
}

Assistant:

uint32_t Hacl_Bignum4096_32_lt_mask(uint32_t *a, uint32_t *b)
{
  uint32_t acc = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(a[i], b[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], b[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  return acc;
}